

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LA32WaveGenerator.cpp
# Opt level: O3

void __thiscall
MT32Emu::LA32WaveGenerator::generateNextSample
          (LA32WaveGenerator *this,Bit32u useAmp,Bit16u usePitch,Bit32u useCutoffVal)

{
  uint uVar1;
  Bit32u BVar2;
  int iVar3;
  Tables *pTVar4;
  Bit16u BVar5;
  uint uVar6;
  uint uVar7;
  anon_enum_32 aVar8;
  
  if (this->active != true) {
    return;
  }
  this->amp = useAmp;
  this->pitch = usePitch;
  if (this->pcmWaveAddress != (Bit16s *)0x0) {
    generateNextPCMWaveLogSamples(this);
    return;
  }
  BVar2 = 0x3c00000;
  if (useCutoffVal < 0x3c00000) {
    BVar2 = useCutoffVal;
  }
  this->cutoffVal = BVar2;
  generateNextSquareWaveLogSample(this);
  generateNextResonanceWaveLogSample(this);
  if (this->sawtoothWaveform == true) {
    uVar7 = this->wavePosition;
    pTVar4 = Tables::getInstance();
    uVar6 = uVar7 >> 9 & 0x1ff;
    uVar1 = uVar6 ^ 0x1ff;
    if ((uVar7 >> 0x12 & 1) != 0) {
      uVar1 = uVar6;
    }
    aVar8 = uVar7 + 0x40000 >> 0x13 & NEGATIVE;
    iVar3 = (pTVar4->logsin9[uVar1] & 0x3fff) * 4;
    uVar7 = (uint)(this->squareLogSample).logValue + iVar3;
    BVar5 = (Bit16u)uVar7;
    if (0xfffe < uVar7) {
      BVar5 = 0xffff;
    }
    (this->squareLogSample).logValue = BVar5;
    (this->squareLogSample).sign = (uint)((this->squareLogSample).sign != aVar8);
    uVar7 = (uint)(this->resonanceLogSample).logValue + iVar3;
    BVar5 = (Bit16u)uVar7;
    if (0xfffe < uVar7) {
      BVar5 = 0xffff;
    }
    (this->resonanceLogSample).logValue = BVar5;
    (this->resonanceLogSample).sign = (uint)((this->resonanceLogSample).sign != aVar8);
  }
  advancePosition(this);
  return;
}

Assistant:

void LA32WaveGenerator::generateNextSample(const Bit32u useAmp, const Bit16u usePitch, const Bit32u useCutoffVal) {
	if (!active) {
		return;
	}

	amp = useAmp;
	pitch = usePitch;

	if (isPCMWave()) {
		generateNextPCMWaveLogSamples();
		return;
	}

	// The 240 cutoffVal limit was determined via sample analysis (internal Munt capture IDs: glop3, glop4).
	// More research is needed to be sure that this is correct, however.
	cutoffVal = (useCutoffVal > MAX_CUTOFF_VALUE) ? MAX_CUTOFF_VALUE : useCutoffVal;

	generateNextSquareWaveLogSample();
	generateNextResonanceWaveLogSample();
	if (sawtoothWaveform) {
		LogSample cosineLogSample;
		generateNextSawtoothCosineLogSample(cosineLogSample);
		LA32Utilites::addLogSamples(squareLogSample, cosineLogSample);
		LA32Utilites::addLogSamples(resonanceLogSample, cosineLogSample);
	}
	advancePosition();
}